

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save-charoutput.c
# Opt level: O0

_Bool save_charoutput(void)

{
  _Bool _Var1;
  ang_file *f;
  _Bool local_411;
  _Bool written;
  ang_file *fo;
  char path [1024];
  
  path_build((char *)&fo,0x400,ANGBAND_DIR_USER,"CharOutput.txt");
  f = file_open((char *)&fo,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    local_411 = false;
  }
  else {
    local_411 = file_put(f,"{\n");
    _Var1 = file_putf(f,"race: \"%s\",\n",player->race->name);
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_putf(f,"class: \"%s\",\n",player->class->name);
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_put(f,"mapName: \"Angband\",\n");
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_putf(f,"dLvl: \"%i\",\n",(ulong)(uint)(int)player->depth);
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_putf(f,"cLvl: \"%i\",\n",(ulong)(uint)(int)player->lev);
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_putf(f,"isDead: \"%i\",\n",(ulong)((player->is_dead & 1U) != 0));
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_putf(f,"killedBy: \"%s\"\n",player->died_from);
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_put(f,"}");
    if (!_Var1) {
      local_411 = false;
    }
    _Var1 = file_close(f);
    if (!_Var1) {
      local_411 = false;
    }
  }
  return local_411;
}

Assistant:

bool save_charoutput(void)
{
	char path[1024];
	ang_file *fo;
	bool written = true;

	path_build(path, sizeof(path), ANGBAND_DIR_USER, "CharOutput.txt");
	fo = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (fo) {
		if (! file_put(fo, "{\n")) written = false;
		if (! file_putf(fo, "race: \"%s\",\n", player->race->name)) written = false;
		if (! file_putf(fo, "class: \"%s\",\n", player->class->name)) written = false;
		if (! file_put(fo, "mapName: \"Angband\",\n")) written = false;
		if (! file_putf(fo, "dLvl: \"%i\",\n", player->depth)) written = false;
		if (! file_putf(fo, "cLvl: \"%i\",\n", player->lev)) written = false;
		if (! file_putf(fo, "isDead: \"%i\",\n", (player->is_dead) ? 1 : 0)) written = false;
		if (! file_putf(fo, "killedBy: \"%s\"\n", player->died_from)) written = false;
		if (! file_put(fo, "}")) written = false;
		if (! file_close(fo)) written = false;
	} else {
		written = false;
	}
	return written;
}